

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Action<void_(int,_mp::obj::Type,_BasicTestExpr<0>)> * __thiscall
testing::internal::OnCallSpec<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::GetAction
          (OnCallSpec<void_(int,_mp::obj::Type,_BasicTestExpr<0>)> *this)

{
  int iVar1;
  allocator<char> local_39;
  string local_38;
  
  iVar1 = *(int *)(this + 0xc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,".WillByDefault() must appear exactly once in an ON_CALL().",
             &local_39);
  UntypedOnCallSpecBase::AssertSpecProperty((UntypedOnCallSpecBase *)this,iVar1 == 2,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (Action<void_(int,_mp::obj::Type,_BasicTestExpr<0>)> *)(this + 0x70);
}

Assistant:

const Action<F>& GetAction() const {
    AssertSpecProperty(last_clause_ == kWillByDefault,
                       ".WillByDefault() must appear exactly "
                       "once in an ON_CALL().");
    return action_;
  }